

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v6::internal::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  char *__s;
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  byte *__s_00;
  byte *pbVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  int iVar12;
  ptrdiff_t _Num;
  ulong uVar13;
  
  iVar12 = this->num_digits_;
  uVar9 = this->exp_ + iVar12;
  if ((this->specs_).field_0x4 == '\x01') {
    *it = *this->digits_;
    iVar12 = this->num_digits_;
    iVar1 = (this->specs_).precision;
    if ((iVar12 < 2) && (((this->specs_).field_0x6 & 0x20) == 0)) {
      pcVar6 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pcVar6 = it + 2;
    }
    uVar10 = iVar1 - iVar12;
    sVar11 = (long)this->num_digits_ - 1;
    if ((long)this->num_digits_ != 1) {
      memmove(pcVar6,this->digits_ + 1,sVar11);
    }
    __s_00 = (byte *)(pcVar6 + sVar11);
    pbVar7 = __s_00;
    if ((0 < (int)uVar10) && (((this->specs_).field_0x6 & 0x20) != 0)) {
      pbVar7 = __s_00 + uVar10;
      memset(__s_00,0x30,(ulong)uVar10);
    }
    *pbVar7 = ((*(uint *)&(this->specs_).field_0x4 >> 0x10 & 1) == 0) << 5 | 0x45;
    pcVar6 = write_exponent<char,char*>(uVar9 - 1,(char *)(pbVar7 + 1));
    return pcVar6;
  }
  if (this->exp_ < 0) {
    if ((int)uVar9 < 1) {
      *it = '0';
      uVar10 = -uVar9;
      uVar13 = (ulong)(uint)this->num_digits_;
      if (uVar13 == 0) {
        uVar2 = (this->specs_).precision;
        uVar4 = uVar10;
        if (SBORROW4(uVar2,uVar10) != (int)(uVar2 + uVar9) < 0) {
          uVar4 = uVar2;
        }
        if (-1 < (int)uVar2) {
          uVar10 = uVar4;
        }
      }
      uVar9 = *(uint *)&(this->specs_).field_0x4 & 0x200000;
      if (0 < this->num_digits_ && (char)(uVar9 >> 0x15) == '\0') {
        do {
          if (this->digits_[uVar13 - 1] != '0') goto LAB_0012c7cc;
          bVar3 = 1 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar3);
        uVar13 = 0;
      }
LAB_0012c7cc:
      iVar12 = (int)uVar13;
      if ((uVar9 == 0 && uVar10 == 0) && iVar12 == 0) {
        pcVar6 = it + 1;
      }
      else {
        it[1] = this->decimal_point_;
        pcVar8 = it + 2;
        pcVar6 = pcVar8;
        if (0 < (int)uVar10) {
          pcVar6 = pcVar8 + uVar10;
          memset(pcVar8,0x30,(ulong)uVar10);
        }
        if (iVar12 != 0) {
          memmove(pcVar6,this->digits_,(long)iVar12);
        }
        pcVar6 = pcVar6 + iVar12;
      }
    }
    else {
      uVar13 = (ulong)uVar9;
      memmove(it,this->digits_,uVar13);
      pcVar6 = it + uVar13;
      if (((this->specs_).field_0x6 & 0x20) == 0) {
        uVar10 = this->num_digits_;
        uVar5 = (ulong)uVar10;
        if ((int)uVar9 < (int)uVar10) {
          uVar5 = (ulong)(int)uVar10;
          do {
            if (this->digits_[uVar5 - 1] != '0') goto LAB_0012c74b;
            uVar5 = uVar5 - 1;
          } while ((long)uVar13 < (long)uVar5);
          uVar5 = (ulong)uVar9;
        }
LAB_0012c74b:
        uVar10 = (uint)uVar5;
        if (uVar10 != uVar9) {
          *pcVar6 = this->decimal_point_;
          pcVar6 = pcVar6 + 1;
        }
        if (uVar10 != uVar9) {
          memmove(pcVar6,this->digits_ + uVar13,(long)(int)uVar10 - uVar13);
        }
        pcVar6 = pcVar6 + ((long)(int)uVar10 - uVar13);
      }
      else {
        *pcVar6 = this->decimal_point_;
        sVar11 = (long)this->num_digits_ - uVar13;
        if (this->num_digits_ != uVar9) {
          memmove(pcVar6 + 1,this->digits_ + uVar13,sVar11);
        }
        pcVar6 = pcVar6 + 1 + sVar11;
        iVar12 = (this->specs_).precision;
        iVar1 = this->num_digits_;
        uVar9 = iVar12 - iVar1;
        if ((uVar9 != 0 && iVar1 <= iVar12) && (uVar9 != 0 && iVar1 <= iVar12)) {
          memset(pcVar6,0x30,(ulong)uVar9);
          pcVar6 = pcVar6 + uVar9;
        }
      }
    }
  }
  else {
    if (iVar12 != 0) {
      memmove(it,this->digits_,(long)iVar12);
    }
    pcVar6 = it + iVar12;
    uVar10 = uVar9 - this->num_digits_;
    pcVar8 = pcVar6;
    if (uVar10 != 0 && this->num_digits_ <= (int)uVar9) {
      pcVar8 = pcVar6 + uVar10;
      memset(pcVar6,0x30,(ulong)uVar10);
    }
    if ((((this->specs_).field_0x6 & 0x20) != 0) || (pcVar6 = pcVar8, (this->specs_).precision < 0))
    {
      __s = pcVar8 + 1;
      *pcVar8 = this->decimal_point_;
      iVar12 = (this->specs_).precision;
      uVar10 = iVar12 - uVar9;
      if (uVar10 == 0 || iVar12 < (int)uVar9) {
        pcVar6 = __s;
        if ((this->specs_).field_0x4 != '\x02') {
          pcVar8[1] = '0';
          pcVar6 = pcVar8 + 2;
        }
      }
      else {
        pcVar6 = __s + uVar10;
        memset(__s,0x30,(ulong)uVar10);
      }
    }
  }
  return pcVar6;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }